

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::PerfEvents_RawEvent::Serialize(PerfEvents_RawEvent *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  PerfEvents_RawEvent *this_local;
  
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,1,this->type_);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,2,this->config_);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,3,this->config1_);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,4,this->config2_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void PerfEvents_RawEvent::Serialize(::protozero::Message* msg) const {
  // Field 1: type
  if (_has_field_[1]) {
    msg->AppendVarInt(1, type_);
  }

  // Field 2: config
  if (_has_field_[2]) {
    msg->AppendVarInt(2, config_);
  }

  // Field 3: config1
  if (_has_field_[3]) {
    msg->AppendVarInt(3, config1_);
  }

  // Field 4: config2
  if (_has_field_[4]) {
    msg->AppendVarInt(4, config2_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}